

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

void __thiscall
cs::
allocator_type<cs_impl::any::holder<std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_64UL,_cs_impl::default_allocator_provider>
::allocator_type(allocator_type<cs_impl::any::holder<std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_64UL,_cs_impl::default_allocator_provider>
                 *this)

{
  size_t sVar1;
  holder<std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *phVar2;
  ulong uVar3;
  
  this->mOffset = 0;
  uVar3 = 0;
  while (uVar3 < 0x20) {
    phVar2 = (holder<std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)operator_new(0x18);
    sVar1 = this->mOffset;
    uVar3 = sVar1 + 1;
    this->mOffset = uVar3;
    this->mPool[sVar1] = phVar2;
  }
  return;
}

Assistant:

allocator_type()
		{
			while (mOffset < 0.5 * blck_size)
				mPool[mOffset++] = mAlloc.allocate(1);
		}